

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O1

Test * __thiscall
testing::internal::
ParameterizedTestFactory<(anonymous_namespace)::LosslessRealtimeTestLarge_TestLosslessEncodingVGALag0_Test>
::CreateTest(ParameterizedTestFactory<(anonymous_namespace)::LosslessRealtimeTestLarge_TestLosslessEncodingVGALag0_Test>
             *this)

{
  LosslessTestLarge *this_00;
  
  WithParamInterface<std::tuple<libaom_test::CodecFactory_const*,libaom_test::TestMode,aom_rc_mode,int>>
  ::parameter_ = &this->parameter_;
  this_00 = (LosslessTestLarge *)operator_new(0x418);
  anon_unknown.dwarf_932166::LosslessTestLarge::LosslessTestLarge(this_00);
  (this_00->super_CodecTestWith3Params<libaom_test::TestMode,_aom_rc_mode,_int>).
  super_TestWithParam<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_aom_rc_mode,_int>_>
  .super_Test._vptr_Test = (_func_int **)&PTR__LosslessTestLarge_01050aa0;
  (this_00->super_CodecTestWith3Params<libaom_test::TestMode,_aom_rc_mode,_int>).
  super_TestWithParam<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_aom_rc_mode,_int>_>
  .
  super_WithParamInterface<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_aom_rc_mode,_int>_>
  ._vptr_WithParamInterface =
       (_func_int **)&PTR__LosslessRealtimeTestLarge_TestLosslessEncodingVGALag0_Test_01050b00;
  (this_00->super_EncoderTest)._vptr_EncoderTest =
       (_func_int **)&PTR__LosslessRealtimeTestLarge_TestLosslessEncodingVGALag0_Test_01050b20;
  return (Test *)this_00;
}

Assistant:

Test* CreateTest() override {
    TestClass::SetParam(&parameter_);
    return new TestClass();
  }